

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O1

void ga_get_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,void *buf,Integer *ld)

{
  Integer lo [2];
  Integer local_28;
  Integer local_20;
  Integer local_18;
  Integer local_10;
  
  local_18 = *ilo;
  local_10 = *jlo;
  local_28 = *ihi;
  local_20 = *jhi;
  pnga_get(*g_a,&local_18,&local_28,buf,ld);
  return;
}

Assistant:

void FATR ga_get_(Integer *g_a, Integer *ilo, Integer *ihi, Integer *jlo,
                  Integer *jhi, void *buf, Integer *ld)
{
  Integer lo[2], hi[2];
  lo[0] = *ilo;
  lo[1] = *jlo;
  hi[0] = *ihi;
  hi[1] = *jhi;
  wnga_get(*g_a, lo, hi, buf, ld);
}